

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canon_sort.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> arr;
  ifstream f;
  fstream of;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_458;
  long local_438 [4];
  byte abStack_418 [488];
  uint local_230 [4];
  char local_220 [512];
  
  std::ifstream::ifstream(local_438,"input",_S_bin);
  std::istream::seekg((long)local_438,_S_beg);
  local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  lVar3 = std::istream::tellg();
  lVar5 = lVar3 + 3;
  if (-1 < lVar3) {
    lVar5 = lVar3;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_458,lVar5 >> 2);
  std::istream::seekg((long)local_438,_S_beg);
  if ((abStack_418[*(long *)(local_438[0] + -0x18)] & 2) == 0) {
    do {
      std::istream::read((char *)local_438,(long)local_230);
      if ((abStack_418[*(long *)(local_438[0] + -0x18)] & 5) == 0) {
        if (local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_458,
                     (iterator)
                     local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,local_230);
        }
        else {
          *local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_230[0];
          local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
    } while ((abStack_418[*(long *)(local_438[0] + -0x18)] & 2) == 0);
  }
  puVar2 = local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar1 = local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar4 = (long)local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar1,puVar2);
  }
  std::fstream::fstream(local_230,argv[1],_S_out|_S_bin);
  std::ostream::write(local_220,
                      (long)local_458.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
  std::fstream::~fstream(local_230);
  if (local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_438);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    ifstream f("input", std::ios::binary);
    f.seekg(0, ios::end);

    vector<uint32_t > arr;
    arr.reserve(f.tellg()/4);

    f.seekg(0, ios::beg);

    while(!f.eof()) {
        uint32_t x;
        f.read((char*)&x, sizeof(x));
        if(f) {
            arr.push_back(x);
        }

    }
    sort(arr.begin(), arr.end());

    fstream of(argv[1], std::ios::binary|std::ios::out);
    of.write((char*)arr.data(), arr.size()*4);
    return 0;
}